

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O1

SampleBuilder * __thiscall tcu::SampleBuilder::operator<<(SampleBuilder *this,deInt64 v)

{
  pointer *ppVVar1;
  iterator __position;
  Value local_18;
  
  local_18.type = TYPE_INT64;
  __position._M_current =
       (this->m_values).
       super__Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_values).
      super__Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_18.value.int64 = v;
    std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
    _M_realloc_insert<tcu::SampleBuilder::Value>(&this->m_values,__position,&local_18);
  }
  else {
    *(ulong *)__position._M_current = (ulong)(uint)local_18._4_4_ << 0x20;
    ((__position._M_current)->value).int64 = v;
    ppVVar1 = &(this->m_values).
               super__Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return this;
}

Assistant:

SampleBuilder&			operator<<			(deInt64 v)	{ m_values.push_back(Value(v));				return *this; }